

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O0

ostream * glu::operator<<(ostream *str,TypeAccessFormat *format)

{
  Type TVar1;
  bool bVar2;
  pointer pVVar3;
  ostream *poVar4;
  StructType *this;
  StructMember *this_00;
  char *pcVar5;
  StructMember *member;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_28;
  const_iterator iter;
  VarType *curType;
  TypeAccessFormat *format_local;
  ostream *str_local;
  
  iter._M_current = (VarTypeComponent *)format->type;
  local_28._M_current =
       (VarTypeComponent *)
       std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                 (format->path);
  do {
    member = (StructMember *)
             std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::end
                       (format->path);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        *)&member);
    if (!bVar2) {
      return str;
    }
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->(&local_28);
    TVar1 = pVVar3->type;
    if (TVar1 == STRUCT_MEMBER) {
      this = VarType::getStructPtr((VarType *)iter._M_current);
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&local_28);
      this_00 = StructType::getMember(this,pVVar3->index);
      poVar4 = std::operator<<(str,".");
      pcVar5 = StructMember::getName(this_00);
      std::operator<<(poVar4,pcVar5);
      iter._M_current = (VarTypeComponent *)StructMember::getType(this_00);
    }
    else {
      if (TVar1 == ARRAY_ELEMENT) {
        iter._M_current = (VarTypeComponent *)VarType::getElementType(iter._M_current);
      }
      else if (1 < TVar1 - MATRIX_COLUMN) goto LAB_011bf558;
      poVar4 = std::operator<<(str,"[");
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&local_28);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pVVar3->index);
      std::operator<<(poVar4,"]");
    }
LAB_011bf558:
    __gnu_cxx::
    __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
    ::operator++(&local_28,0);
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& str, const TypeAccessFormat& format)
{
	const VarType* curType = &format.type;

	for (TypeComponentVector::const_iterator iter = format.path.begin(); iter != format.path.end(); iter++)
	{
		switch (iter->type)
		{
			case VarTypeComponent::ARRAY_ELEMENT:
				curType = &curType->getElementType(); // Update current type.
				// Fall-through.

			case VarTypeComponent::MATRIX_COLUMN:
			case VarTypeComponent::VECTOR_COMPONENT:
				str << "[" << iter->index << "]";
				break;

			case VarTypeComponent::STRUCT_MEMBER:
			{
				const StructMember& member = curType->getStructPtr()->getMember(iter->index);
				str << "." << member.getName();
				curType = &member.getType();
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return str;
}